

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

void __thiscall
Layer::set_labels(Layer *this,
                 initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *labels)

{
  pointer pPVar1;
  uint uVar2;
  iterator label;
  
  label = labels->_M_array;
  uVar2 = 0;
  while( true ) {
    pPVar1 = (this->m_perceptrons).super__Vector_base<Perceptron,_std::allocator<Perceptron>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((ulong)(((long)(this->m_perceptrons).
                        super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pPVar1) / 0x50) <= (ulong)uVar2)
       || (label == labels->_M_array + labels->_M_len)) break;
    Perceptron::set_label(pPVar1 + uVar2,label);
    uVar2 = uVar2 + 1;
    label = label + 1;
  }
  return;
}

Assistant:

void  Layer::set_labels(const std::initializer_list<std::string>& labels){
    auto label=labels.begin();
    for(uint i=0;i<m_perceptrons.size() && label!=labels.end();++i, ++label){
        m_perceptrons[i].set_label(*label);
    }
}